

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_get_char(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uchar *puVar4;
  undefined8 uStack_10;
  
  iVar1 = bson_utf8_get_char("asdf");
  if (iVar1 == 0x61) {
    uVar2 = bson_utf8_next_char("asdf");
    iVar1 = bson_utf8_get_char(uVar2);
    if (iVar1 == 0x73) {
      uVar2 = bson_utf8_next_char(uVar2);
      iVar1 = bson_utf8_get_char(uVar2);
      if (iVar1 == 100) {
        uVar2 = bson_utf8_next_char(uVar2);
        iVar1 = bson_utf8_get_char(uVar2);
        if (iVar1 == 0x66) {
          pcVar3 = (char *)bson_utf8_next_char(uVar2);
          if (*pcVar3 == '\0') {
            iVar1 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
            if (iVar1 == 0x20ac) {
              puVar4 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
              if (puVar4 == test_bson_utf8_get_char::test2 + 3) {
                iVar1 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
                if (iVar1 == 0x20) {
                  uVar2 = bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
                  iVar1 = bson_utf8_get_char(uVar2);
                  if (iVar1 == 0x20ac) {
                    uVar2 = bson_utf8_next_char(uVar2);
                    iVar1 = bson_utf8_get_char(uVar2);
                    if (iVar1 == 0x20) {
                      uVar2 = bson_utf8_next_char(uVar2);
                      iVar1 = bson_utf8_get_char(uVar2);
                      if (iVar1 == 0x20ac) {
                        pcVar3 = (char *)bson_utf8_next_char(uVar2);
                        if (*pcVar3 == '\0') {
                          return;
                        }
                        pcVar3 = "!*c";
                        uStack_10 = 0x88;
                      }
                      else {
                        pcVar3 = "bson_utf8_get_char (c) == 0x20AC";
                        uStack_10 = 0x86;
                      }
                    }
                    else {
                      pcVar3 = "bson_utf8_get_char (c) == \' \'";
                      uStack_10 = 0x84;
                    }
                  }
                  else {
                    pcVar3 = "bson_utf8_get_char (c) == 0x20AC";
                    uStack_10 = 0x82;
                  }
                }
                else {
                  pcVar3 = "bson_utf8_get_char (c) == \' \'";
                  uStack_10 = 0x80;
                }
              }
              else {
                pcVar3 = "c == (const char *) test2 + 3";
                uStack_10 = 0x7f;
              }
            }
            else {
              pcVar3 = "bson_utf8_get_char (c) == 0x20AC";
              uStack_10 = 0x7d;
            }
          }
          else {
            pcVar3 = "!*c";
            uStack_10 = 0x7a;
          }
        }
        else {
          pcVar3 = "bson_utf8_get_char (c) == \'f\'";
          uStack_10 = 0x78;
        }
      }
      else {
        pcVar3 = "bson_utf8_get_char (c) == \'d\'";
        uStack_10 = 0x76;
      }
    }
    else {
      pcVar3 = "bson_utf8_get_char (c) == \'s\'";
      uStack_10 = 0x74;
    }
  }
  else {
    pcVar3 = "bson_utf8_get_char (c) == \'a\'";
    uStack_10 = 0x72;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
          uStack_10,"test_bson_utf8_get_char",pcVar3);
  abort();
}

Assistant:

static void
test_bson_utf8_get_char (void)
{
   static const char *test1 = "asdf";
   static const unsigned char test2[] = {
      0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, 0};
   const char *c;

   c = test1;
   BSON_ASSERT (bson_utf8_get_char (c) == 'a');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 's');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'd');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'f');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);

   c = (const char *) test2;
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (c == (const char *) test2 + 3);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);
}